

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::csharp::TryRemovePrefix
                   (string *__return_storage_ptr__,string *prefix,string *value)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  size_t i;
  ulong uVar7;
  allocator<char> local_49;
  string prefix_to_match;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&prefix_to_match,"",&local_49);
  for (uVar7 = 0; uVar7 < prefix->_M_string_length; uVar7 = uVar7 + 1) {
    if ((prefix->_M_dataplus)._M_p[uVar7] != '_') {
      std::__cxx11::string::push_back((char)&prefix_to_match);
    }
  }
  pcVar2 = (value->_M_dataplus)._M_p;
  uVar7 = value->_M_string_length;
  uVar5 = 0;
  uVar4 = 0;
  while (uVar5 < prefix_to_match._M_string_length) {
    if (uVar7 == uVar4) goto LAB_00249d0d;
    cVar1 = pcVar2[uVar4];
    if (cVar1 != '_') {
      cVar6 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar6 = cVar1;
      }
      if (cVar6 != prefix_to_match._M_dataplus._M_p[uVar5]) goto LAB_00249d0d;
      uVar5 = uVar5 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  uVar5 = uVar4;
  if (uVar4 < uVar7) {
    uVar5 = uVar7;
  }
  for (; (uVar3 = uVar5, uVar5 != uVar4 && (uVar3 = uVar4, pcVar2[uVar4] == '_')); uVar4 = uVar4 + 1
      ) {
  }
  if (uVar3 == uVar7) {
LAB_00249d0d:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)value);
  }
  std::__cxx11::string::~string((string *)&prefix_to_match);
  return __return_storage_ptr__;
}

Assistant:

std::string TryRemovePrefix(const std::string& prefix, const std::string& value) {
  // First normalize to a lower-case no-underscores prefix to match against
  std::string prefix_to_match = "";
  for (size_t i = 0; i < prefix.size(); i++) {
    if (prefix[i] != '_') {
      prefix_to_match += ascii_tolower(prefix[i]);
    }
  }
  
  // This keeps track of how much of value we've consumed
  size_t prefix_index, value_index;
  for (prefix_index = 0, value_index = 0;
      prefix_index < prefix_to_match.size() && value_index < value.size();
      value_index++) {
    // Skip over underscores in the value
    if (value[value_index] == '_') {
      continue;
    }
    if (ascii_tolower(value[value_index]) != prefix_to_match[prefix_index++]) {
      // Failed to match the prefix - bail out early.
      return value;
    }
  }

  // If we didn't finish looking through the prefix, we can't strip it.
  if (prefix_index < prefix_to_match.size()) {
    return value;
  }

  // Step over any underscores after the prefix
  while (value_index < value.size() && value[value_index] == '_') {
    value_index++;
  }

  // If there's nothing left (e.g. it was a prefix with only underscores afterwards), don't strip.
  if (value_index == value.size()) {
    return value;
  }

  return value.substr(value_index);
}